

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

void l2_parse_formal_param_list(l2_scope *scope_p,l2_vector *expr_info_vec_p)

{
  undefined8 uVar1;
  l2_symbol symbol;
  l2_parsing_error_type error_type;
  boolean bVar2;
  l2_token *plVar3;
  int *piVar4;
  int cols;
  int lines;
  ulong uVar5;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 local_38;
  undefined8 uStack_30;
  int local_24;
  
  uVar5 = 0;
  plVar3 = l2_parse_token_current();
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_IDENTIFIER);
  if (bVar2 != '\0') {
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    if (expr_info_vec_p->size == 0) {
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_IDENTIFIER);
      if ((bVar2 == '\0') && (bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RP), bVar2 == '\0')
         ) {
        return;
      }
      l2_parse_token_forward();
      lines = plVar3->current_line;
      cols = plVar3->current_col;
      error_type = L2_PARSING_ERROR_TOO_FEW_PARAMETERS;
      goto LAB_00109f2a;
    }
    piVar4 = (int *)l2_vector_at(expr_info_vec_p,0);
    if (*piVar4 - 1U < 5) {
      uVar1 = *(undefined8 *)(piVar4 + 2);
      switch(*piVar4) {
      case 1:
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        error_type = L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE;
        goto LAB_00109f2a;
      case 2:
        local_48 = 2;
        local_38 = CONCAT44(local_38._4_4_,(int)uVar1);
        break;
      case 3:
        local_48 = 3;
        local_38 = uVar1;
        break;
      case 4:
        local_48 = 4;
        local_38 = CONCAT71(local_38._1_7_,(char)uVar1);
        break;
      case 5:
        uStack_30 = *(undefined8 *)(piVar4 + 4);
        local_48 = 5;
        local_38 = uVar1;
      }
    }
    symbol._4_4_ = uStack_44;
    symbol.type = local_48;
    symbol.symbol_name = (plVar3->u).c_str;
    symbol.u.real = (double)local_38;
    symbol.u.procedure.upper_scope_p = (l2_scope *)uStack_30;
    bVar2 = l2_symbol_table_add_symbol(&scope_p->symbol_table_p,symbol);
    if (bVar2 == '\0') {
      l2_parsing_error(L2_PARSING_ERROR_IDENTIFIER_REDEFINED,plVar3->current_line,
                       plVar3->current_col,(plVar3->u).c_str);
    }
    local_24 = 1;
    l2_parse_formal_param_list1(scope_p,expr_info_vec_p,&local_24);
    uVar5 = (ulong)local_24;
  }
  if (expr_info_vec_p->size <= uVar5) {
    return;
  }
  lines = plVar3->current_line;
  cols = plVar3->current_col;
  error_type = L2_PARSING_ERROR_TOO_MANY_PARAMETERS;
LAB_00109f2a:
  l2_parsing_error(error_type,lines,cols);
}

Assistant:

void l2_parse_formal_param_list(l2_scope *scope_p, l2_vector *expr_info_vec_p) {
    _declr_current_token_p
    _get_current_token_p
    int symbol_pos = 0;

    _if_type (L2_TOKEN_IDENTIFIER)
    {
        _get_current_token_p
        if (symbol_pos < expr_info_vec_p->size) {

            l2_symbol symbol;

            l2_expr_info real_expr_info = *(l2_expr_info *)l2_vector_at(expr_info_vec_p, symbol_pos);

            switch (real_expr_info.val_type) {
                case L2_EXPR_VAL_TYPE_BOOL:
                    symbol.type = L2_SYMBOL_TYPE_BOOL;
                    symbol.u.bool = real_expr_info.val.bool;
                    break;

                case L2_EXPR_VAL_TYPE_INTEGER:
                    symbol.type = L2_SYMBOL_TYPE_INTEGER;
                    symbol.u.integer = real_expr_info.val.integer;
                    break;

                case L2_EXPR_VAL_TYPE_REAL:
                    symbol.type = L2_SYMBOL_TYPE_REAL;
                    symbol.u.real = real_expr_info.val.real;
                    break;

                case L2_EXPR_VAL_TYPE_PROCEDURE:
                    symbol.type = L2_SYMBOL_TYPE_PROCEDURE;
                    symbol.u.procedure = real_expr_info.val.procedure;
                    break;

                case L2_EXPR_VAL_NO_VAL:
                    l2_parsing_error(L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE, current_token_p->current_line, current_token_p->current_col);
            }

            symbol.symbol_name = current_token_p->u.str.str_p;

            boolean add_symbol_result = l2_symbol_table_add_symbol(&scope_p->symbol_table_p, symbol);

            if (!add_symbol_result) {
                l2_parsing_error(L2_PARSING_ERROR_IDENTIFIER_REDEFINED, current_token_p->current_line, current_token_p->current_col, current_token_p->u.str.str_p);
            }

            symbol_pos += 1;
            l2_parse_formal_param_list1(scope_p, expr_info_vec_p, &symbol_pos);

        }
        else
        {
            _if_type (L2_TOKEN_IDENTIFIER)
            {
                l2_parsing_error(L2_PARSING_ERROR_TOO_FEW_PARAMETERS, current_token_p->current_line, current_token_p->current_col);
            }
            _elif_type(L2_TOKEN_RP)
            {
                l2_parsing_error(L2_PARSING_ERROR_TOO_FEW_PARAMETERS, current_token_p->current_line, current_token_p->current_col);
            }
            _else
            {
                /* symbol_pos == symbol_vec_p->size ( means real parameters list is over ) */
                /* and next token is not identifier ( means formal parameters list is over ) */
                return;
            }
        }

    }